

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

void __thiscall H264StreamReader::~H264StreamReader(H264StreamReader *this)

{
  SPSUnit *this_00;
  PPSUnit *this_01;
  bool bVar1;
  reference __in;
  type *ppSVar2;
  reference __in_00;
  type *ppPVar3;
  type *pps;
  type *index_1;
  _Self local_58;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
  *__range1_1;
  type *sps;
  type *index;
  _Self local_28;
  iterator __end1;
  iterator __begin1;
  map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
  *__range1;
  H264StreamReader *this_local;
  
  __end1 = std::
           map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
           ::begin(&this->m_spsMap);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
       ::end(&this->m_spsMap);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_28);
    if (!bVar1) break;
    __in = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator*(&__end1);
    std::get<0ul,unsigned_int_const,SPSUnit*>(__in);
    ppSVar2 = std::get<1ul,unsigned_int_const,SPSUnit*>(__in);
    this_00 = *ppSVar2;
    if (this_00 != (SPSUnit *)0x0) {
      SPSUnit::~SPSUnit(this_00);
      operator_delete(this_00,0x200);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator++(&__end1);
  }
  __end1_1 = std::
             map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
             ::begin(&this->m_ppsMap);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
       ::end(&this->m_ppsMap);
  while( true ) {
    bVar1 = std::operator!=(&__end1_1,&local_58);
    if (!bVar1) break;
    __in_00 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_PPSUnit_*>_>::operator*
                        (&__end1_1);
    std::get<0ul,unsigned_int_const,PPSUnit*>(__in_00);
    ppPVar3 = std::get<1ul,unsigned_int_const,PPSUnit*>(__in_00);
    this_01 = *ppPVar3;
    if (this_01 != (PPSUnit *)0x0) {
      PPSUnit::~PPSUnit(this_01);
      operator_delete(this_01,0x58);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_PPSUnit_*>_>::operator++(&__end1_1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_decodedSliceHeader);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_bdRomMetaDataMsg);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->m_lastSeiMvcHeader);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            (&this->updatedSPSList);
  std::
  map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
  ::~map(&this->m_ppsMap);
  std::
  map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
  ::~map(&this->m_spsMap);
  MPEGStreamReader::~MPEGStreamReader(&this->super_MPEGStreamReader);
  return;
}

Assistant:

H264StreamReader::~H264StreamReader()
{
    for (const auto &[index, sps] : m_spsMap) delete sps;
    for (const auto &[index, pps] : m_ppsMap) delete pps;
}